

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampRangeClampCase::init
          (TextureBorderClampRangeClampCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  *this_00;
  TextureChannelClass TVar1;
  deUint32 dVar2;
  bool bVar3;
  pointer pIVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float afVar15 [4];
  undefined1 auVar16 [16];
  GenericVec4 GVar17;
  TextureFormat texFormat;
  IVec4 numBits;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  TextureFormat local_e0;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  _Alloc_hider local_90;
  char *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80 [2];
  undefined8 local_58;
  undefined8 uStack_50;
  Vec4 local_48;
  
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  local_e0 = tcu::getEffectiveDepthStencilTextureFormat
                       ((TextureFormat *)
                        &((this->super_TextureBorderClampTest).m_texture.
                          super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                          m_data.ptr)->m_refTexture,
                        (this->super_TextureBorderClampTest).m_sampleMode);
  bVar3 = isDepthFormat((this->super_TextureBorderClampTest).m_texFormat,
                        (this->super_TextureBorderClampTest).m_sampleMode);
  TVar1 = (this->super_TextureBorderClampTest).m_channelClass;
  if (TVar1 == TEXTURECHANNELCLASS_FLOATING_POINT || bVar3) {
    local_88 = (char *)0x0;
    local_80[0]._M_local_buf[0] = '\0';
    local_d8._0_4_ = -1.2;
    local_d8._4_4_ = -3.0;
    local_d8._8_4_ = 1.2;
    local_d8._12_4_ = 2.5;
    local_d8._16_8_ = 0x7f8000007f800000;
    local_d8._24_8_ = 0x7f8000007f800000;
    local_b8._0_8_ = &DAT_3f0000003f000000;
    local_b8._8_8_ = &DAT_3f0000003f000000;
    local_a8._0_4_ = 0.25;
    local_a8._4_4_ = 0.25;
    uStack_a0._0_4_ = 0.25;
    uStack_a0._4_4_ = 0.25;
    local_90._M_p = (pointer)local_80;
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1c64a3b);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,(value_type *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != local_80) {
      operator_delete(local_90._M_p,
                      CONCAT71(local_80[0]._M_allocated_capacity._1_7_,local_80[0]._M_local_buf[0])
                      + 1);
    }
    local_88 = (char *)0x0;
    local_80[0]._M_local_buf[0] = '\0';
    local_d8._0_4_ = -0.25;
    local_d8._4_4_ = -0.75;
    local_d8._8_4_ = 2.25;
    local_d8._12_4_ = 1.25;
    local_d8._16_8_ = 0xff800000ff800000;
    local_d8._24_8_ = 0xff800000ff800000;
    local_b8._8_8_ = &DAT_3f0000003f000000;
    local_b8._0_8_ = &DAT_3f0000003f000000;
    uStack_a0._0_4_ = 0.25;
    uStack_a0._4_4_ = 0.25;
    local_a8._0_4_ = 0.25;
    local_a8._4_4_ = 0.25;
    local_90._M_p = (pointer)local_80;
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1c64a51);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,(value_type *)local_d8);
  }
  else if ((TVar1 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) == TEXTURECHANNELCLASS_SIGNED_INTEGER
          ) {
    tcu::getTextureFormatBitDepth((tcu *)&local_48,&local_e0);
    uVar10 = -1 << (local_48.m_data[3]._0_1_ - 1 & 0x1f);
    uVar6 = 0x80000000;
    if ((int)local_48.m_data[3] < 0x20) {
      uVar6 = uVar10;
    }
    uVar9 = 0;
    if (local_48.m_data[3] == 0.0) {
      uVar6 = 0;
    }
    uVar11 = -1 << (local_48.m_data[2]._0_1_ - 1 & 0x1f);
    uVar13 = 0x80000000;
    if ((int)local_48.m_data[2] < 0x20) {
      uVar13 = uVar11;
    }
    if (local_48.m_data[2] == 0.0) {
      uVar13 = 0;
    }
    uVar12 = -1 << (local_48.m_data[1]._0_1_ - 1 & 0x1f);
    uVar8 = 0x80000000;
    if ((int)local_48.m_data[1] < 0x20) {
      uVar8 = uVar12;
    }
    if (local_48.m_data[1] == 0.0) {
      uVar8 = uVar9;
    }
    uVar14 = -1 << (local_48.m_data[0]._0_1_ - 1 & 0x1f);
    uVar5 = 0x80000000;
    if ((int)local_48.m_data[0] < 0x20) {
      uVar5 = uVar14;
    }
    TVar1 = (this->super_TextureBorderClampTest).m_channelClass;
    if (local_48.m_data[0] == 0.0) {
      uVar5 = 0;
    }
    if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      uVar6 = 0;
      uVar8 = 0;
      uVar13 = 0;
      uVar5 = 0;
    }
    uStack_50 = (undefined1 *)CONCAT44(uVar6,uVar13);
    local_58 = (undefined1 *)CONCAT44(uVar8,uVar5);
    if (local_48.m_data[0] == 0.0) {
      uVar14 = 0;
      if (local_48.m_data[1] != 0.0) {
        uVar9 = 0;
        if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_014f470e;
LAB_014f46d7:
        uVar14 = 0x7fffffff;
        if ((int)local_48.m_data[1] < 0x20) {
          uVar14 = ~uVar12;
        }
      }
    }
    else {
      if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        uVar9 = 0x7fffffff;
        if ((int)local_48.m_data[0] < 0x20) {
          uVar9 = ~uVar14;
        }
        if (local_48.m_data[1] != 0.0) goto LAB_014f46d7;
      }
      else {
        uVar9 = ~(-1 << (local_48.m_data[0]._0_1_ & 0x1f));
        if (0x1f < (int)local_48.m_data[0]) {
          uVar9 = 0xffffffff;
        }
        if (local_48.m_data[1] != 0.0) {
LAB_014f470e:
          uVar14 = ~(-1 << (local_48.m_data[1]._0_1_ & 0x1f));
          if (0x1f < (int)local_48.m_data[1]) {
            uVar14 = 0xffffffff;
          }
          goto LAB_014f489c;
        }
      }
      uVar14 = 0;
    }
LAB_014f489c:
    if (local_48.m_data[2] == 0.0) {
      uVar12 = 0;
      if (local_48.m_data[3] == 0.0) goto LAB_014f4912;
      if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_014f48f8;
LAB_014f48cb:
      uVar11 = 0x7fffffff;
      if ((int)local_48.m_data[3] < 0x20) {
        uVar11 = ~uVar10;
      }
    }
    else {
      if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        uVar12 = 0x7fffffff;
        if ((int)local_48.m_data[2] < 0x20) {
          uVar12 = ~uVar11;
        }
        if (local_48.m_data[3] != 0.0) goto LAB_014f48cb;
      }
      else {
        uVar12 = ~(-1 << (local_48.m_data[2]._0_1_ & 0x1f));
        if (0x1f < (int)local_48.m_data[2]) {
          uVar12 = 0xffffffff;
        }
        if (local_48.m_data[3] != 0.0) {
LAB_014f48f8:
          uVar11 = ~(-1 << (local_48.m_data[3]._0_1_ & 0x1f));
          if (0x1f < (int)local_48.m_data[3]) {
            uVar11 = 0xffffffff;
          }
          goto LAB_014f4914;
        }
      }
LAB_014f4912:
      uVar11 = 0;
    }
LAB_014f4914:
    local_88 = (char *)0x0;
    local_80[0]._M_local_buf[0] = '\0';
    local_d8._0_4_ = -1.2;
    local_d8._4_4_ = -3.0;
    local_d8._8_4_ = 1.2;
    local_d8._12_4_ = 2.5;
    local_d8._20_4_ = uVar14 + 1;
    local_d8._16_4_ = uVar9 + 1;
    local_d8._28_4_ = uVar11 + 1;
    local_d8._24_4_ = uVar12 + 1;
    auVar16._0_4_ = (float)(int)((uVar9 - uVar5) + (uint)(uVar9 - uVar5 == 0));
    auVar16._4_4_ = (float)(int)((uVar14 - uVar8) + (uint)(uVar14 - uVar8 == 0));
    auVar16._8_4_ = (float)(int)((uVar12 - uVar13) + (uint)(uVar12 - uVar13 == 0));
    auVar16._12_4_ = (float)(int)((uVar11 - uVar6) + (uint)(uVar11 - uVar6 == 0));
    local_b8 = divps((undefined1  [16])_DAT_01a04320,auVar16);
    _local_a8 = _DAT_01a04320;
    if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      _local_a8 = _DAT_01b84100;
    }
    local_90._M_p = (pointer)local_80;
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1c64a70);
    this_00 = &this->m_iterations;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(this_00,(value_type *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != local_80) {
      operator_delete(local_90._M_p,
                      CONCAT71(local_80[0]._M_allocated_capacity._1_7_,local_80[0]._M_local_buf[0])
                      + 1);
    }
    local_d8._28_4_ = 0xffffffff;
    local_d8._16_4_ = 0xffffffff;
    local_d8._20_4_ = 0xffffffff;
    local_d8._24_4_ = 0xffffffff;
    if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      local_88 = (char *)0x0;
      local_80[0]._M_local_buf[0] = '\0';
      local_d8._0_4_ = -0.25;
      local_d8._4_4_ = -0.75;
      local_d8._8_4_ = 2.25;
      local_d8._12_4_ = 1.25;
      local_d8._20_4_ = local_58._4_4_ + -1;
      local_d8._16_4_ = (int)local_58 + -1;
      local_d8._28_4_ = uStack_50._4_4_ + -1;
      local_d8._24_4_ = (int)uStack_50 + -1;
      local_b8 = divps((undefined1  [16])_DAT_01a04320,auVar16);
      local_a8._0_4_ = _DAT_01a04320;
      local_a8._4_4_ = _UNK_01a04324;
      uStack_a0._0_4_ = _UNK_01a04328;
      uStack_a0._4_4_ = _UNK_01a0432c;
      local_90._M_p = (pointer)local_80;
      std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1c64a96);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
      ::push_back(this_00,(value_type *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != local_80) {
        operator_delete(local_90._M_p,
                        CONCAT71(local_80[0]._M_allocated_capacity._1_7_,local_80[0]._M_local_buf[0]
                                ) + 1);
      }
      local_d8._16_4_ = 0x7fffffff;
      local_d8._20_4_ = 0x7fffffff;
      local_d8._24_4_ = 0x7fffffff;
      local_d8._28_4_ = 0x7fffffff;
    }
    local_88 = (char *)0x0;
    local_80[0]._M_local_buf[0] = '\0';
    local_d8._0_4_ = -1.6;
    local_d8._4_4_ = -2.1;
    local_d8._8_4_ = 1.2;
    local_d8._12_4_ = 3.5;
    afVar15 = (float  [4])divps((undefined1  [16])_DAT_01a04320,auVar16);
    local_a8._0_4_ = 0.25;
    local_a8._4_4_ = 0.25;
    uStack_a0._0_4_ = 0.25;
    uStack_a0._4_4_ = 0.25;
    local_b8 = (undefined1  [16])afVar15;
    local_90._M_p = (pointer)local_80;
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1c64aba);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(this_00,(value_type *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != local_80) {
      operator_delete(local_90._M_p,
                      CONCAT71(local_80[0]._M_allocated_capacity._1_7_,local_80[0]._M_local_buf[0])
                      + 1);
    }
    if (TVar1 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_014f4b6c;
    local_88 = (char *)0x0;
    local_80[0]._M_local_buf[0] = '\0';
    local_d8._0_4_ = -2.6;
    local_d8._4_4_ = -4.0;
    local_d8._8_4_ = 1.1;
    local_d8._12_4_ = 1.5;
    local_d8._16_8_ = 0x8000000080000000;
    local_d8._24_8_ = 0x8000000080000000;
    uStack_a0._0_4_ = 0.25;
    uStack_a0._4_4_ = 0.25;
    local_a8._0_4_ = 0.25;
    local_a8._4_4_ = 0.25;
    local_b8 = (undefined1  [16])afVar15;
    local_90._M_p = (pointer)local_80;
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1c64ad7);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(this_00,(value_type *)local_d8);
  }
  else {
    if (TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT < TVar1) goto LAB_014f4b6c;
    if (TVar1 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_58 = &DAT_3f0000003f000000;
      uStack_50 = &DAT_3f0000003f000000;
      local_f8 = (undefined1 *)0x3e8000003e800000;
      puStack_f0 = (undefined1 *)0x3e8000003e800000;
    }
    else {
      local_f8 = &DAT_3f0000003f000000;
      puStack_f0 = &DAT_3f0000003f000000;
      local_58 = (undefined1 *)0x3e8000003e800000;
      uStack_50 = (undefined1 *)0x3e8000003e800000;
    }
    _local_a8 = (float  [4])ZEXT816(0);
    local_b8 = ZEXT816(0);
    local_d8._16_8_ = 0;
    local_d8._24_8_ = 0;
    local_88 = (char *)0x0;
    local_80[0]._M_local_buf[0] = '\0';
    local_d8._0_4_ = -1.2;
    local_d8._4_4_ = -3.0;
    local_d8._8_4_ = 1.2;
    local_d8._12_4_ = 2.5;
    local_48.m_data[0] = 1.1;
    local_48.m_data[1] = 1.3;
    local_48.m_data[2] = 2.2;
    local_48.m_data[3] = 1.3;
    local_90._M_p = (pointer)local_80;
    GVar17 = mapToFormatColorUnits(&local_e0,&local_48);
    local_d8._16_8_ = GVar17.v._0_8_;
    local_d8._24_8_ = GVar17.v._8_8_;
    local_b8._0_8_ = local_f8;
    local_b8._8_8_ = puStack_f0;
    local_a8 = (undefined1  [8])local_58;
    uStack_a0 = uStack_50;
    std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,0x1c64ae7);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,(value_type *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != local_80) {
      operator_delete(local_90._M_p,
                      CONCAT71(local_80[0]._M_allocated_capacity._1_7_,local_80[0]._M_local_buf[0])
                      + 1);
    }
    _local_a8 = (float  [4])ZEXT816(0);
    local_b8 = ZEXT816(0);
    local_d8._16_8_ = 0;
    local_d8._24_8_ = 0;
    local_88 = (char *)0x0;
    local_80[0]._M_local_buf[0] = '\0';
    local_d8._0_4_ = -0.25;
    local_d8._4_4_ = -0.75;
    local_d8._8_4_ = 2.25;
    local_d8._12_4_ = 1.25;
    local_48.m_data[0] = -0.2;
    local_48.m_data[1] = -0.9;
    local_48.m_data[2] = -2.4;
    local_48.m_data[3] = -0.6;
    local_90._M_p = (pointer)local_80;
    GVar17 = mapToFormatColorUnits(&local_e0,&local_48);
    local_d8._16_8_ = GVar17.v._0_8_;
    local_d8._24_8_ = GVar17.v._8_8_;
    local_b8._8_8_ = puStack_f0;
    local_b8._0_8_ = local_f8;
    uStack_a0 = uStack_50;
    local_a8 = (undefined1  [8])local_58;
    std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,0x1c64b09);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,(value_type *)local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != local_80) {
    operator_delete(local_90._M_p,
                    CONCAT71(local_80[0]._M_allocated_capacity._1_7_,local_80[0]._M_local_buf[0]) +
                    1);
  }
LAB_014f4b6c:
  pIVar4 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (int)((long)(this->m_iterations).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4 >> 3) * -0x11111111;
  if (0 < (int)uVar6) {
    dVar2 = this->m_filter;
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    pIVar4 = (pointer)&pIVar4->compareRef;
    do {
      pIVar4[-1].magFilter = dVar2;
      *(deUint32 *)&pIVar4[-1].description._M_dataplus._M_p = dVar2;
      pIVar4[-1].tWrapMode = 0x812d;
      pIVar4[-1].compareMode = 0x812d;
      *(undefined8 *)&pIVar4[-1].compareRef = 0;
      pIVar4 = pIVar4 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return (int)pIVar4;
}

Assistant:

void TextureBorderClampRangeClampCase::init (void)
{
	TextureBorderClampTest::init();

	const tcu::TextureFormat	texFormat		= tcu::getEffectiveDepthStencilTextureFormat(getTexture()->getRefTexture().getFormat(), m_sampleMode);
	const bool					isDepth			= isDepthFormat(m_texFormat, m_sampleMode);
	const bool					isFloat			= m_channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	const bool					isFixed			= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT || m_channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
	const bool					isPureInteger	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER || m_channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER;

	if (isDepth || isFloat)
	{
		// infinities are commonly used values on depth/float borders
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= rr::GenericVec4(tcu::Vec4(std::numeric_limits<float>::infinity()));
			iteration.lookupScale	= tcu::Vec4(0.5f); // scale & bias to [0.25, 0.5] range to make out-of-range values visible
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border value infinity";
			m_iterations.push_back(iteration);
		}
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-std::numeric_limits<float>::infinity()));
			iteration.lookupScale	= tcu::Vec4(0.5f);
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border value negative infinity";
			m_iterations.push_back(iteration);
		}
	}
	else if (isPureInteger)
	{
		const tcu::IVec4			numBits		= tcu::getTextureFormatBitDepth(texFormat);
		const bool					isSigned	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER;

		// can't overflow 32bit integers with 32bit integers
		for (int ndx = 0; ndx < 4; ++ndx)
			DE_ASSERT(numBits[ndx] == 0 || numBits[ndx] == 8 || numBits[ndx] == 16);

		const tcu::IVec4	minValue		= getNBitIntegerVec4MinValue(isSigned, numBits);
		const tcu::IVec4	maxValue		= getNBitIntegerVec4MaxValue(isSigned, numBits);
		const tcu::IVec4	valueRange		= maxValue - minValue;
		const tcu::IVec4	divSafeRange	((valueRange[0]==0) ? (1) : (valueRange[0]),
											 (valueRange[1]==0) ? (1) : (valueRange[1]),
											 (valueRange[2]==0) ? (1) : (valueRange[2]),
											 (valueRange[3]==0) ? (1) : (valueRange[3]));

		// format max
		{
			const tcu::IVec4 value = maxValue + tcu::IVec4(1);

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= (isSigned) ? (rr::GenericVec4(value)) : (rr::GenericVec4(value.cast<deUint32>()));
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= (isSigned) ? (tcu::Vec4(0.5f)) : (tcu::Vec4(0.25f));
			iteration.description	= "border values one larger than maximum";
			m_iterations.push_back(iteration);
		}
		// format min
		if (isSigned)
		{
			const tcu::IVec4 value = minValue - tcu::IVec4(1);

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= rr::GenericVec4(value);
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.5f);
			iteration.description	= "border values one less than minimum";
			m_iterations.push_back(iteration);
		}
		// (u)int32 max
		{
			const tcu::IVec4 value = (isSigned) ? (tcu::IVec4(std::numeric_limits<deInt32>::max())) : (tcu::IVec4(std::numeric_limits<deUint32>::max()));

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.6f, -2.1f);
			iteration.p1			= tcu::Vec2( 1.2f,  3.5f);
			iteration.borderColor	= (isSigned) ? (rr::GenericVec4(value)) : (rr::GenericVec4(value.cast<deUint32>()));
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border values 32-bit maximum";
			m_iterations.push_back(iteration);
		}
		// int32 min
		if (isSigned)
		{
			const tcu::IVec4 value = tcu::IVec4(std::numeric_limits<deInt32>::min());

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-2.6f, -4.0f);
			iteration.p1			= tcu::Vec2( 1.1f,  1.5f);
			iteration.borderColor	= rr::GenericVec4(value);
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border values 0";
			m_iterations.push_back(iteration);
		}
	}
	else if (isFixed)
	{
		const bool		isSigned	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;;
		const tcu::Vec4	lookupBias	= (isSigned) ? (tcu::Vec4(0.5f))    : (tcu::Vec4(0.25f)); // scale & bias to [0.25, 0.5] range to make out-of-range values visible
		const tcu::Vec4	lookupScale	= (isSigned) ? (tcu::Vec4(0.25f))   : (tcu::Vec4(0.5f));

		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= mapToFormatColorUnits(texFormat, tcu::Vec4(1.1f, 1.3f, 2.2f, 1.3f));
			iteration.lookupScale	= lookupScale;
			iteration.lookupBias	= lookupBias;
			iteration.description	= "border values larger than maximum";
			m_iterations.push_back(iteration);
		}
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= mapToFormatColorUnits(texFormat, tcu::Vec4(-0.2f, -0.9f, -2.4f, -0.6f));
			iteration.lookupScale	= lookupScale;
			iteration.lookupBias	= lookupBias;
			iteration.description	= "border values less than minimum";
			m_iterations.push_back(iteration);
		}
	}
	else
		DE_ASSERT(false);

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.compareMode	= GL_NONE;
		iteration.compareRef	= 0.0f;
	}
}